

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__mad3sizes_valid(int a,int b,int c,int add)

{
  int iVar1;
  undefined1 local_19;
  int add_local;
  int c_local;
  int b_local;
  int a_local;
  
  iVar1 = stbi__mul2sizes_valid(a,b);
  local_19 = false;
  if (iVar1 != 0) {
    iVar1 = stbi__mul2sizes_valid(a * b,c);
    local_19 = false;
    if (iVar1 != 0) {
      iVar1 = stbi__addsizes_valid(a * b * c,add);
      local_19 = iVar1 != 0;
    }
  }
  return (int)local_19;
}

Assistant:

static int stbi__mad3sizes_valid(int a, int b, int c, int add)
{
   return stbi__mul2sizes_valid(a, b) && stbi__mul2sizes_valid(a*b, c) &&
      stbi__addsizes_valid(a*b*c, add);
}